

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileIf(jx9_gen_state *pGen)

{
  uint uVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  sxi32 sVar4;
  long lVar5;
  SyToken *pSVar6;
  char *zFormat;
  sxu32 nLine;
  GenBlock **ppBlock;
  SyToken *pSVar7;
  sxu32 nJumpIdx;
  GenBlock *pCondBlock;
  SyToken *pEnd;
  
  pEnd = (SyToken *)0x0;
  pCondBlock = (GenBlock *)0x0;
  pSVar6 = pGen->pIn + 1;
  pGen->pIn = pSVar6;
  sVar3 = GenStateEnterBlock(pGen,4,pGen->pVm->pByteContainer->nUsed,(void *)0x0,&pCondBlock);
  sVar4 = -10;
  if (sVar3 == 0) {
    while (pSVar6 < pGen->pEnd) {
      if ((pSVar6->nType & 0x200) == 0) {
        lVar5 = 0;
        goto LAB_00122f6c;
      }
      pSVar7 = pSVar6 + 1;
      jx9DelimitNestedTokens(pSVar7,pGen->pEnd,0x200,0x400,&pEnd);
      pSVar2 = pEnd;
      if ((pEnd <= pSVar7) || ((pEnd->nType & 0x400) == 0)) {
        if (pSVar7 < pGen->pEnd) {
          pSVar6 = pSVar7;
        }
        nLine = pSVar6->nLine;
        zFormat = "if/else/elseif: Missing \')\'";
        goto LAB_00122f78;
      }
      pSVar6 = pGen->pEnd;
      pGen->pIn = pSVar7;
      pGen->pEnd = pEnd;
      sVar4 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
      pSVar7 = pGen->pIn;
      while (pSVar7 < pSVar2) {
        jx9GenCompileError(pGen,1,pSVar7->nLine,"Unexpected token \'%z\'");
        pSVar7 = pGen->pIn + 1;
        pGen->pIn = pSVar7;
      }
      pGen->pIn = pSVar2 + 1;
      pGen->pEnd = pSVar6;
      if (sVar4 == -10) {
        return -10;
      }
      jx9VmEmitInstr(pGen->pVm,9,0,0,(void *)0x0,&nJumpIdx);
      GenStateNewJumpFixup(pCondBlock,9,nJumpIdx);
      sVar4 = jx9CompileBlock(pGen);
      if (sVar4 == -10) {
        return -10;
      }
      pSVar6 = pGen->pIn;
      if (((pGen->pEnd <= pSVar6) || ((pSVar6->nType & 4) == 0)) ||
         (uVar1 = *(uint *)&pSVar6->pUserData, (uVar1 & 0xc000000) == 0)) {
LAB_00122ec3:
        GenStateFixJumps(pCondBlock,9,pGen->pVm->pByteContainer->nUsed);
        pSVar6 = pGen->pIn;
        if (((pSVar6 < pGen->pEnd) && ((pSVar6->nType & 4) != 0)) &&
           (((ulong)pSVar6->pUserData & 0x8000000) != 0)) {
          pGen->pIn = pSVar6 + 1;
          sVar4 = jx9CompileBlock(pGen);
          if (sVar4 == -10) {
            return -10;
          }
        }
        nJumpIdx = pGen->pVm->pByteContainer->nUsed;
        ppBlock = (GenBlock **)0x8;
        GenStateFixJumps(pCondBlock,8,nJumpIdx);
        GenStateLeaveBlock(pGen,ppBlock);
        return 0;
      }
      jx9VmEmitInstr(pGen->pVm,8,0,0,(void *)0x0,&nJumpIdx);
      GenStateNewJumpFixup(pCondBlock,8,nJumpIdx);
      pSVar6 = pGen->pIn;
      if (((uVar1 >> 0x1b & 1) != 0) &&
         (((pGen->pEnd <= pSVar6 + 1 || ((pSVar6[1].nType & 4) == 0)) ||
          (pSVar7 = pSVar6 + 1, pSVar6 = pSVar6 + 1, *(int *)&pSVar7->pUserData != 3))))
      goto LAB_00122ec3;
      pSVar6 = pSVar6 + 1;
      pGen->pIn = pSVar6;
      GenStateFixJumps(pCondBlock,9,pGen->pVm->pByteContainer->nUsed);
    }
    lVar5 = -0x20;
LAB_00122f6c:
    nLine = *(sxu32 *)((long)&pSVar6->nLine + lVar5);
    zFormat = "if/else/elseif: Missing \'(\'";
LAB_00122f78:
    sVar3 = jx9GenCompileError(pGen,1,nLine,zFormat);
    sVar4 = -10;
    if (sVar3 != -10) {
      pSVar6 = pGen->pIn;
      sVar4 = 0;
      while ((pSVar6 < pGen->pEnd && ((pSVar6->nType & 0x40040) == 0))) {
        pSVar6 = pSVar6 + 1;
        pGen->pIn = pSVar6;
      }
    }
  }
  return sVar4;
}

Assistant:

static sxi32 jx9CompileIf(jx9_gen_state *pGen)
{
	SyToken *pToken, *pTmp, *pEnd = 0;
	GenBlock *pCondBlock = 0;
	sxu32 nJumpIdx;
	sxu32 nKeyID;
	sxi32 rc;
	/* Jump the 'if' keyword */
	pGen->pIn++;
	pToken = pGen->pIn; 
	/* Create the conditional block */
	rc = GenStateEnterBlock(&(*pGen), GEN_BLOCK_COND, jx9VmInstrLength(pGen->pVm), 0, &pCondBlock);
	if( rc != SXRET_OK ){
		return SXERR_ABORT;
	}
	/* Process as many [if/else if/elseif/else] blocks as we can */
	for(;;){
		if( pToken >= pGen->pEnd || (pToken->nType & JX9_TK_LPAREN) == 0 ){
			/* Syntax error */
			if( pToken >= pGen->pEnd ){
				pToken--;
			}
			rc = jx9GenCompileError(pGen, E_ERROR, pToken->nLine, "if/else/elseif: Missing '('");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			goto Synchronize;
		}
		/* Jump the left parenthesis '(' */
		pToken++; 
		/* Delimit the condition */
		jx9DelimitNestedTokens(pToken, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
		if( pToken >= pEnd || (pEnd->nType & JX9_TK_RPAREN) == 0 ){
			/* Syntax error */
			if( pToken >= pGen->pEnd ){
				pToken--;
			}
			rc = jx9GenCompileError(pGen, E_ERROR, pToken->nLine, "if/else/elseif: Missing ')'");
			if( rc == SXERR_ABORT ){
				/* Error count limit reached, abort immediately */
				return SXERR_ABORT;
			}
			goto Synchronize;
		}
		/* Swap token streams */
		SWAP_TOKEN_STREAM(pGen, pToken, pEnd);
		/* Compile the condition */
		rc = jx9CompileExpr(&(*pGen), 0, 0);
		/* Update token stream */
		while(pGen->pIn < pEnd ){
			jx9GenCompileError(&(*pGen), E_ERROR, pGen->pIn->nLine, "Unexpected token '%z'", &pGen->pIn->sData);
			pGen->pIn++;
		}
		pGen->pIn  = &pEnd[1];
		pGen->pEnd = pTmp;
		if( rc == SXERR_ABORT ){
			/* Expression handler request an operation abort [i.e: Out-of-memory] */
			return SXERR_ABORT;
		}
		/* Emit the false jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JZ, 0, 0, 0, &nJumpIdx);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pCondBlock, JX9_OP_JZ, nJumpIdx);
		/* Compile the body */
		rc = jx9CompileBlock(&(*pGen));
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		if( pGen->pIn >= pGen->pEnd || (pGen->pIn->nType & JX9_TK_KEYWORD) == 0 ){
			break;
		}
		/* Ensure that the keyword ID is 'else if' or 'else' */
		nKeyID = (sxu32)SX_PTR_TO_INT(pGen->pIn->pUserData);
		if( (nKeyID & (JX9_TKWRD_ELSE|JX9_TKWRD_ELIF)) == 0 ){
			break;
		}
		/* Emit the unconditional jump */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, 0, 0, &nJumpIdx);
		/* Save the instruction index so we can fix it later when the jump destination is resolved */
		GenStateNewJumpFixup(pCondBlock, JX9_OP_JMP, nJumpIdx);
		if( nKeyID & JX9_TKWRD_ELSE ){
			pToken = &pGen->pIn[1];
			if( pToken >= pGen->pEnd || (pToken->nType & JX9_TK_KEYWORD) == 0 ||
				SX_PTR_TO_INT(pToken->pUserData) != JX9_TKWRD_IF ){
					break;
			}
			pGen->pIn++; /* Jump the 'else' keyword */
		}
		pGen->pIn++; /* Jump the 'elseif/if' keyword */
		/* Synchronize cursors */
		pToken = pGen->pIn;
		/* Fix the false jump */
		GenStateFixJumps(pCondBlock, JX9_OP_JZ, jx9VmInstrLength(pGen->pVm));
	} /* For(;;) */
	/* Fix the false jump */
	GenStateFixJumps(pCondBlock, JX9_OP_JZ, jx9VmInstrLength(pGen->pVm));
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_KEYWORD) &&
		(SX_PTR_TO_INT(pGen->pIn->pUserData) & JX9_TKWRD_ELSE) ){
			/* Compile the else block */
			pGen->pIn++;
			rc = jx9CompileBlock(&(*pGen));
			if( rc == SXERR_ABORT ){
				
				return SXERR_ABORT;
			}
	}
	nJumpIdx = jx9VmInstrLength(pGen->pVm);
	/* Fix all unconditional jumps now the destination is resolved */
	GenStateFixJumps(pCondBlock, JX9_OP_JMP, nJumpIdx);
	/* Release the conditional block */
	GenStateLeaveBlock(pGen, 0);
	/* Statement successfully compiled */
	return SXRET_OK;
Synchronize:
	/* Synchronize with the first semi-colon ';' so we can avoid compiling this erroneous block.
	 */
	while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & (JX9_TK_SEMI|JX9_TK_OCB)) == 0 ){
		pGen->pIn++;
	}
	return SXRET_OK;
}